

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser * init_parse_eff(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_eff_name);
  parser_reg(p,"power int power",parse_eff_power);
  parser_reg(p,"eval int eval",parse_eff_eval);
  parser_reg(p,"desc str desc",parse_eff_desc);
  parser_reg(p,"lore-color-base sym color",parse_eff_lore_color);
  parser_reg(p,"lore-color-resist sym color",parse_eff_lore_color_resist);
  parser_reg(p,"lore-color-immune sym color",parse_eff_lore_color_immune);
  parser_reg(p,"effect-type str type",parse_eff_effect_type);
  parser_reg(p,"resist str resist",parse_eff_resist);
  parser_reg(p,"lash-type str type",parse_eff_lash_type);
  return p;
}

Assistant:

static struct parser *init_parse_eff(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_eff_name);
	parser_reg(p, "power int power", parse_eff_power);
	parser_reg(p, "eval int eval", parse_eff_eval);
	parser_reg(p, "desc str desc", parse_eff_desc);
	parser_reg(p, "lore-color-base sym color", parse_eff_lore_color);
	parser_reg(p, "lore-color-resist sym color", parse_eff_lore_color_resist);
	parser_reg(p, "lore-color-immune sym color", parse_eff_lore_color_immune);
	parser_reg(p, "effect-type str type", parse_eff_effect_type);
	parser_reg(p, "resist str resist", parse_eff_resist);
	parser_reg(p, "lash-type str type", parse_eff_lash_type);
	return p;
}